

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEval.cpp
# Opt level: O3

ExprBase * EvaluateFunctionCall(ExpressionEvalContext *ctx,ExprFunctionCall *expression)

{
  Allocator *pAVar1;
  SynBase *pSVar2;
  TypeBase *pTVar3;
  ExprFunctionDefinition *expression_00;
  int iVar4;
  uint uVar5;
  undefined4 extraout_var;
  ExprFunctionLiteral *ptr;
  ExprBase *pEVar6;
  FunctionData *data;
  ExprBase *pEVar7;
  ulong uVar8;
  ExprVariableDefinition *pEVar9;
  ulong uVar10;
  ArrayView<ExprBase_*> arguments_00;
  ArrayView<ExprBase_*> arguments_01;
  SmallArray<ExprBase_*,_8U> arguments;
  SmallArray<ExprBase_*,_8U> local_88;
  
  uVar5 = (ctx->stackFrames).count;
  if ((uVar5 != 0) && ((ctx->stackFrames).data[uVar5 - 1]->targetYield != 0)) {
    pAVar1 = ctx->ctx->allocator;
    iVar4 = (*pAVar1->_vptr_Allocator[2])(pAVar1,0x30);
    pEVar7 = (ExprBase *)CONCAT44(extraout_var,iVar4);
    pSVar2 = (expression->super_ExprBase).source;
    pTVar3 = ctx->ctx->typeVoid;
    pEVar7->typeID = 2;
    pEVar7->source = pSVar2;
    pEVar7->type = pTVar3;
    pEVar7->next = (ExprBase *)0x0;
    pEVar7->listed = false;
    pEVar7->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e6b38;
    return pEVar7;
  }
  if (ctx->instructionsLimit <= ctx->instruction) {
    Report(ctx,"ERROR: instruction limit reached");
    return (ExprBase *)0x0;
  }
  ctx->instruction = ctx->instruction + 1;
  ptr = (ExprFunctionLiteral *)Evaluate(ctx,expression->function);
  uVar10 = 0;
  if (ptr == (ExprFunctionLiteral *)0x0) {
    return (ExprBase *)0x0;
  }
  local_88.allocator = ctx->ctx->allocator;
  local_88.data = local_88.little;
  local_88.count = 0;
  local_88.max = 8;
  pEVar7 = (expression->arguments).head;
  if (pEVar7 != (ExprBase *)0x0) {
    do {
      pEVar6 = Evaluate(ctx,pEVar7);
      if (pEVar6 == (ExprBase *)0x0) goto LAB_0025338a;
      if (local_88.count == local_88.max) {
        SmallArray<ExprBase_*,_8U>::grow(&local_88,local_88.count);
      }
      if (local_88.data == (ExprBase **)0x0) {
        __assert_fail("data",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                      ,0x162,
                      "void SmallArray<ExprBase *, 8>::push_back(const T &) [T = ExprBase *, N = 8]"
                     );
      }
      uVar8 = (ulong)local_88.count;
      local_88.count = local_88.count + 1;
      uVar10 = (ulong)local_88.count;
      local_88.data[uVar8] = pEVar6;
      pEVar7 = pEVar7->next;
    } while (pEVar7 != (ExprBase *)0x0);
  }
  if ((ptr->super_ExprBase).typeID == 0xb) {
    data = ptr->data;
    if (data == (FunctionData *)0x0) {
      pEVar7 = (ExprBase *)0x0;
      Report(ctx,"ERROR: null function pointer call");
      goto LAB_0025338d;
    }
    expression_00 = (ExprFunctionDefinition *)data->declaration;
    if (expression_00 == (ExprFunctionDefinition *)0x0) {
      if (((ctx->emulateKnownExternals == true) &&
          (uVar5 = ExpressionContext::GetFunctionIndex(ctx->ctx,data),
          uVar5 < ctx->ctx->baseModuleFunctionCount)) &&
         (arguments_00.count = local_88.count, arguments_00.data = local_88.data,
         arguments_00._12_4_ = 0,
         pEVar7 = EvaluateKnownExternalFunctionCall(ctx,expression,ptr,arguments_00),
         pEVar7 != (ExprBase *)0x0)) goto LAB_0025338d;
      data = ptr->data;
    }
    else if (data->isPrototype != true) {
      if ((expression_00->super_ExprBase).typeID != 0x24) {
        __assert_fail("declaration",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                      ,0xad2,
                      "ExprBase *EvaluateFunctionCall(ExpressionEvalContext &, ExprFunctionCall *)")
        ;
      }
      iVar4 = 0;
      for (pEVar9 = (expression_00->arguments).head; pEVar9 != (ExprVariableDefinition *)0x0;
          pEVar9 = (ExprVariableDefinition *)(pEVar9->super_ExprBase).next) {
        iVar4 = iVar4 + 1;
      }
      if ((iVar4 == (int)uVar10) &&
         (arguments_01._8_8_ = uVar10, arguments_01.data = local_88.data,
         pEVar7 = EvaluateFunction(ctx,expression_00,ptr->context,arguments_01),
         pEVar7 != (ExprBase *)0x0)) {
        pEVar7 = CheckType(&expression->super_ExprBase,pEVar7);
        goto LAB_0025338d;
      }
      goto LAB_0025338a;
    }
    pEVar7 = (ExprBase *)0x0;
    Report(ctx,"ERROR: function \'%.*s\' has no source",
           (ulong)(uint)(*(int *)&(data->name->name).end - (int)(data->name->name).begin));
  }
  else {
LAB_0025338a:
    pEVar7 = (ExprBase *)0x0;
  }
LAB_0025338d:
  SmallArray<ExprBase_*,_8U>::~SmallArray(&local_88);
  return pEVar7;
}

Assistant:

ExprBase* EvaluateFunctionCall(ExpressionEvalContext &ctx, ExprFunctionCall *expression)
{
	if(!ctx.stackFrames.empty() && ctx.stackFrames.back()->targetYield)
		return new (ctx.ctx.get<ExprVoid>()) ExprVoid(expression->source, ctx.ctx.typeVoid);

	if(!AddInstruction(ctx))
		return NULL;
	
	ExprBase *function = Evaluate(ctx, expression->function);

	if(!function)
		return NULL;

	SmallArray<ExprBase*, 8> arguments(ctx.ctx.allocator);

	for(ExprBase *curr = expression->arguments.head; curr; curr = curr->next)
	{
		ExprBase *value = Evaluate(ctx, curr);

		if(!value)
			return NULL;

		arguments.push_back(value);
	}

	ExprFunctionLiteral *ptr = getType<ExprFunctionLiteral>(function);

	if(!ptr)
		return NULL;

	if(!ptr->data)
		return Report(ctx, "ERROR: null function pointer call");

	if(!ptr->data->declaration)
	{
		if(ctx.emulateKnownExternals && ctx.ctx.GetFunctionIndex(ptr->data) < ctx.ctx.baseModuleFunctionCount)
		{
			if(ExprBase *result = EvaluateKnownExternalFunctionCall(ctx, expression, ptr, arguments))
				return result;
		}

		return Report(ctx, "ERROR: function '%.*s' has no source", FMT_ISTR(ptr->data->name->name));
	}

	if(ptr->data->isPrototype)
		return Report(ctx, "ERROR: function '%.*s' has no source", FMT_ISTR(ptr->data->name->name));

	ExprFunctionDefinition *declaration = getType<ExprFunctionDefinition>(ptr->data->declaration);

	assert(declaration);

	if(declaration->arguments.size() != arguments.size())
		return NULL;

	ExprBase *call = EvaluateFunction(ctx, declaration, ptr->context, arguments);

	if(!call)
		return NULL;

	return CheckType(expression, call);
}